

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xref.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  QPDF qpdf;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  local_60 [8];
  _Rb_tree_node_base local_58;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"usage: test_xref INPUT.pdf");
    std::endl<char,std::char_traits<char>>(poVar2);
LAB_00101508:
    exit(2);
  }
  QPDF::QPDF(&qpdf);
  QPDF::processFile((char *)&qpdf,argv[1]);
  QPDF::getXRefTable();
  p_Var3 = local_58._M_left;
  do {
    if (p_Var3 == &local_58) {
      std::
      _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
      ::~_Rb_tree(local_60);
      QPDF::~QPDF(&qpdf);
      return 0;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var3[1]._M_color);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&p_Var3[1].field_0x4);
    std::operator<<(poVar2,", ");
    iVar1 = QPDFXRefEntry::getType();
    poVar2 = (ostream *)&std::cout;
    pcVar4 = "free entry";
    if (iVar1 == 0) {
LAB_00101431:
      poVar2 = std::operator<<(poVar2,pcVar4);
    }
    else {
      if (iVar1 == 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"uncompressed, offset = ");
        QPDFXRefEntry::getOffset();
        poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
        poVar2 = std::operator<<(poVar2," (0x");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        QPDFXRefEntry::getOffset();
        poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        pcVar4 = ")";
        goto LAB_00101431;
      }
      if (iVar1 != 2) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"unknown");
        std::endl<char,std::char_traits<char>>(poVar2);
        goto LAB_00101508;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"compressed, stream number = ");
      iVar1 = QPDFXRefEntry::getObjStreamNumber();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,", stream index = ");
      iVar1 = QPDFXRefEntry::getObjStreamIndex();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    }
    std::endl<char,std::char_traits<char>>(poVar2);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "usage: test_xref INPUT.pdf" << std::endl;
        std::exit(2);
    }

    try {
        QPDF qpdf;
        qpdf.processFile(argv[1]);

        for (auto const& iter: qpdf.getXRefTable()) {
            std::cout << iter.first.getObj() << "/" << iter.first.getGen() << ", ";
            switch (iter.second.getType()) {
            case 0:
                std::cout << "free entry" << std::endl;
                break;
            case 1:
                std::cout << "uncompressed, offset = " << iter.second.getOffset() << " (0x"
                          << std::hex << iter.second.getOffset() << std::dec << ")" << std::endl;
                break;
            case 2:
                std::cout << "compressed, stream number = " << iter.second.getObjStreamNumber()
                          << ", stream index = " << iter.second.getObjStreamIndex() << std::endl;
                break;
            default:
                std::cerr << "unknown" << std::endl;
                std::exit(2);
            }
        }
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        std::exit(2);
    }

    return 0;
}